

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::ArrayInputStream::ArrayInputStream
          (ArrayInputStream *this,void *data,int size,int block_size)

{
  int in_ECX;
  int in_EDX;
  _func_int **in_RSI;
  ZeroCopyInputStream *in_RDI;
  int local_2c;
  
  ZeroCopyInputStream::ZeroCopyInputStream(in_RDI);
  in_RDI->_vptr_ZeroCopyInputStream = (_func_int **)&PTR__ArrayInputStream_00960bf0;
  in_RDI[1]._vptr_ZeroCopyInputStream = in_RSI;
  *(int *)&in_RDI[2]._vptr_ZeroCopyInputStream = in_EDX;
  local_2c = in_EDX;
  if (0 < in_ECX) {
    local_2c = in_ECX;
  }
  *(int *)((long)&in_RDI[2]._vptr_ZeroCopyInputStream + 4) = local_2c;
  *(undefined4 *)&in_RDI[3]._vptr_ZeroCopyInputStream = 0;
  *(undefined4 *)((long)&in_RDI[3]._vptr_ZeroCopyInputStream + 4) = 0;
  return;
}

Assistant:

ArrayInputStream::ArrayInputStream(const void* data, int size, int block_size)
    : data_(reinterpret_cast<const uint8*>(data)),
      size_(size),
      block_size_(block_size > 0 ? block_size : size),
      position_(0),
      last_returned_size_(0) {}